

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O3

void Omega_h::transfer_densities_and_conserve_coarsen
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,LOs *keys2verts,Adj *keys2doms,
               LOs *prods2new_ents,LOs *same_ents2old_ents,LOs *same_ents2new_ents)

{
  int *piVar1;
  uint ent_dim;
  Write<double> new_elem_densities_w_00;
  Write<double> new_elem_densities_w_01;
  Write<double> new_elem_densities_w_02;
  undefined1 auVar2 [12];
  Alloc *pAVar3;
  undefined8 uVar4;
  pointer pCVar5;
  bool bVar6;
  Int IVar7;
  LO LVar8;
  Mesh *new_mesh_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  long lVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  Write<double> new_elem_densities_w;
  Cavs color_cavs;
  LOs keys2prods;
  Adj bdry_keys2doms;
  Cavs init_cavs;
  CavsByBdryStatus cavs;
  Alloc *pAVar13;
  void *in_stack_fffffffffffffc30;
  uint in_stack_fffffffffffffc38;
  int local_3a4;
  Write<double> local_3a0;
  undefined1 local_390 [24];
  undefined1 local_378 [16];
  void *local_368;
  undefined1 local_360 [32];
  Alloc *local_340;
  void *local_338;
  Alloc *local_330;
  void *local_328;
  undefined1 local_320 [24];
  pointer local_308;
  LOs local_300;
  Alloc *local_2f0;
  pointer local_2e8;
  Mesh *local_2e0;
  LOs local_2d8;
  Alloc *local_2c8;
  pointer local_2c0;
  Alloc *local_2b8;
  pointer local_2b0;
  Alloc *local_2a8;
  pointer local_2a0;
  LOs local_298;
  undefined1 local_288 [48];
  LOs local_258;
  Cavs local_248;
  Cavs local_208;
  Cavs local_1c8;
  Cavs local_188;
  Cavs local_148;
  pointer local_108;
  pointer local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  pointer local_58;
  
  bVar6 = has_densities_or_conserved(old_mesh,opts);
  if (bVar6) {
    local_2f0 = (keys2doms->super_Graph).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_2f0 & 7) == 0 && local_2f0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_2f0 = (Alloc *)(local_2f0->size * 8 + 1);
      }
      else {
        local_2f0->use_count = local_2f0->use_count + 1;
      }
    }
    local_308 = (pointer)(keys2doms->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
    local_300.write_.shared_alloc_.alloc = (keys2verts->write_).shared_alloc_.alloc;
    if (((ulong)local_300.write_.shared_alloc_.alloc & 7) == 0 &&
        local_300.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_300.write_.shared_alloc_.alloc =
             (Alloc *)((local_300.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_300.write_.shared_alloc_.alloc)->use_count =
             (local_300.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar13 = local_300.write_.shared_alloc_.alloc;
    local_300.write_.shared_alloc_.direct_ptr = (keys2verts->write_).shared_alloc_.direct_ptr;
    local_320._16_8_ = local_2f0;
    if (((ulong)local_2f0 & 7) == 0 && local_2f0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_320._16_8_ = local_2f0->size * 8 + 1;
      }
      else {
        local_2f0->use_count = local_2f0->use_count + 1;
      }
    }
    uVar4 = local_320._16_8_;
    local_258.write_.shared_alloc_.alloc = (prods2new_ents->write_).shared_alloc_.alloc;
    if (((ulong)local_258.write_.shared_alloc_.alloc & 7) == 0 &&
        local_258.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_258.write_.shared_alloc_.alloc =
             (Alloc *)((local_258.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_258.write_.shared_alloc_.alloc)->use_count =
             (local_258.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar3 = local_258.write_.shared_alloc_.alloc;
    local_258.write_.shared_alloc_.direct_ptr = (prods2new_ents->write_).shared_alloc_.direct_ptr;
    local_2e8 = local_308;
    form_initial_cavs(&local_148,old_mesh,(Mesh *)(ulong)(uint)new_mesh->dim_,0,&local_300,
                      (LOs *)(local_320 + 0x10),&local_258);
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    if ((uVar4 & 7) == 0 && (Alloc *)uVar4 != (Alloc *)0x0) {
      piVar1 = (int *)(uVar4 + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)uVar4);
        operator_delete((void *)uVar4,0x48);
      }
    }
    if (((ulong)pAVar13 & 7) == 0 && pAVar13 != (Alloc *)0x0) {
      piVar1 = &pAVar13->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar13);
        operator_delete(pAVar13,0x48);
      }
    }
    local_288._0_8_ = (keys2doms->super_Graph).a2ab.write_.shared_alloc_.alloc;
    if ((local_288._0_8_ & 7) == 0 && (Alloc *)local_288._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_288._0_8_ = ((Alloc *)local_288._0_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_288._0_8_)->use_count = ((Alloc *)local_288._0_8_)->use_count + 1;
      }
    }
    local_288._8_8_ = (keys2doms->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
    local_288._16_8_ = (keys2doms->super_Graph).ab2b.write_.shared_alloc_.alloc;
    if ((local_288._16_8_ & 7) == 0 && (Alloc *)local_288._16_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_288._16_8_ = ((Alloc *)local_288._16_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_288._16_8_)->use_count = ((Alloc *)local_288._16_8_)->use_count + 1;
      }
    }
    local_288._24_8_ = (keys2doms->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
    local_288._32_8_ = (keys2doms->codes).write_.shared_alloc_.alloc;
    if ((local_288._32_8_ & 7) == 0 && (Alloc *)local_288._32_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_288._32_8_ = ((Alloc *)local_288._32_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_288._32_8_)->use_count = ((Alloc *)local_288._32_8_)->use_count + 1;
      }
    }
    local_288._40_8_ = (keys2doms->codes).write_.shared_alloc_.direct_ptr;
    local_188.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
         local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
         local_148.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_188.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
         local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
         local_148.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_188.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
         local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
         local_148.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_188.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
         local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
         local_148.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_298.write_.shared_alloc_.alloc = (keys2verts->write_).shared_alloc_.alloc;
    if (((ulong)local_298.write_.shared_alloc_.alloc & 7) == 0 &&
        local_298.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_298.write_.shared_alloc_.alloc =
             (Alloc *)((local_298.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_298.write_.shared_alloc_.alloc)->use_count =
             (local_298.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar3 = local_298.write_.shared_alloc_.alloc;
    local_298.write_.shared_alloc_.direct_ptr = (keys2verts->write_).shared_alloc_.direct_ptr;
    pAVar13 = (Alloc *)local_288;
    separate_cavities((CavsByBdryStatus *)&stack0xfffffffffffffef8,old_mesh,new_mesh,&local_188,0,
                      &local_298,(Graph *)pAVar13);
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    Cavs::~Cavs(&local_188);
    ent_dim = old_mesh->dim_;
    if (3 < ent_dim) {
      fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
           ,0x33);
    }
    local_2e0 = (Mesh *)opts;
    for (local_3a4 = 0; IVar7 = Mesh::ntags(old_mesh,ent_dim), local_3a4 < IVar7;
        local_3a4 = local_3a4 + 1) {
      new_mesh_00 = (Mesh *)Mesh::get_tag(old_mesh,ent_dim,local_3a4);
      bVar6 = should_conserve(old_mesh,opts,ent_dim,(TagBase *)new_mesh_00);
      if ((bVar6) || (bVar6 = is_density(old_mesh,opts,ent_dim,(TagBase *)new_mesh_00), bVar6)) {
        IVar7 = TagBase::ncomps((TagBase *)new_mesh_00);
        LVar8 = Mesh::nelems(new_mesh);
        local_360._0_8_ = local_360 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"");
        Write<double>::Write(&local_3a0,LVar8 * IVar7,(string *)local_360);
        if ((Alloc *)local_360._0_8_ != (Alloc *)(local_360 + 0x10)) {
          operator_delete((void *)local_360._0_8_,(ulong)(local_360._16_8_ + 1));
        }
        local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (local_108->keys2old_elems).a2ab.write_.shared_alloc_.alloc;
        if (((ulong)local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
            local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
                 (Alloc *)((local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
                 (local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
             (local_108->keys2old_elems).a2ab.write_.shared_alloc_.direct_ptr;
        local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (local_108->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
        if (((ulong)local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
            local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
                 (Alloc *)((local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
                 (local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
             (local_108->keys2old_elems).ab2b.write_.shared_alloc_.direct_ptr;
        local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (local_108->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
        if (((ulong)local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
            local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
                 (Alloc *)((local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
                 (local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
             (local_108->keys2new_elems).a2ab.write_.shared_alloc_.direct_ptr;
        local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (local_108->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
        if (((ulong)local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
            local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
                 (Alloc *)((local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
                 (local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
             (local_108->keys2new_elems).ab2b.write_.shared_alloc_.direct_ptr;
        local_2a8 = local_3a0.shared_alloc_.alloc;
        if (((ulong)local_3a0.shared_alloc_.alloc & 7) == 0 &&
            local_3a0.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_2a8 = (Alloc *)((local_3a0.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_3a0.shared_alloc_.alloc)->use_count =
                 (local_3a0.shared_alloc_.alloc)->use_count + 1;
          }
        }
        pAVar3 = local_2a8;
        local_2a0 = (pointer)local_3a0.shared_alloc_.direct_ptr;
        new_elem_densities_w_00.shared_alloc_.direct_ptr = in_stack_fffffffffffffc30;
        new_elem_densities_w_00.shared_alloc_.alloc = pAVar13;
        transfer_by_intersection
                  ((Omega_h *)old_mesh,new_mesh,new_mesh_00,(TagBase *)&local_1c8,(Cavs *)local_2a8,
                   new_elem_densities_w_00);
        if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
          piVar1 = &pAVar3->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar3);
            operator_delete(pAVar3,0x48);
          }
        }
        Cavs::~Cavs(&local_1c8);
        local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (local_c0->keys2old_elems).a2ab.write_.shared_alloc_.alloc;
        if (((ulong)local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
            local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
                 (Alloc *)((local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
                 (local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_208.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
             (local_c0->keys2old_elems).a2ab.write_.shared_alloc_.direct_ptr;
        local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (local_c0->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
        if (((ulong)local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
            local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
                 (Alloc *)((local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
                 (local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_208.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
             (local_c0->keys2old_elems).ab2b.write_.shared_alloc_.direct_ptr;
        local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (local_c0->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
        if (((ulong)local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
            local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
                 (Alloc *)((local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
                 (local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_208.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
             (local_c0->keys2new_elems).a2ab.write_.shared_alloc_.direct_ptr;
        local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (local_c0->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
        if (((ulong)local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
            local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
                 (Alloc *)((local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
                 (local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_208.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
             (local_c0->keys2new_elems).ab2b.write_.shared_alloc_.direct_ptr;
        local_2b8 = local_3a0.shared_alloc_.alloc;
        if (((ulong)local_3a0.shared_alloc_.alloc & 7) == 0 &&
            local_3a0.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_2b8 = (Alloc *)((local_3a0.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_3a0.shared_alloc_.alloc)->use_count =
                 (local_3a0.shared_alloc_.alloc)->use_count + 1;
          }
        }
        pAVar3 = local_2b8;
        local_2b0 = (pointer)local_3a0.shared_alloc_.direct_ptr;
        new_elem_densities_w_01.shared_alloc_.direct_ptr = in_stack_fffffffffffffc30;
        new_elem_densities_w_01.shared_alloc_.alloc = pAVar13;
        transfer_by_intersection
                  ((Omega_h *)old_mesh,new_mesh,new_mesh_00,(TagBase *)&local_208,(Cavs *)local_2b8,
                   new_elem_densities_w_01);
        if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
          piVar1 = &pAVar3->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar3);
            operator_delete(pAVar3,0x48);
          }
        }
        Cavs::~Cavs(&local_208);
        pCVar5 = local_58;
        for (_Var9._M_pi = local_60._M_pi; opts = (TransferOpts *)local_2e0,
            (pointer)_Var9._M_pi != pCVar5; _Var9._M_pi = _Var9._M_pi + 0x40) {
          local_360._0_8_ = (((pointer)_Var9._M_pi)->keys2old_elems).a2ab.write_.shared_alloc_.alloc
          ;
          if ((local_360._0_8_ & 7) == 0 && (Alloc *)local_360._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_360._0_8_ = ((Alloc *)local_360._0_8_)->size * 8 + 1;
            }
            else {
              ((Alloc *)local_360._0_8_)->use_count = ((Alloc *)local_360._0_8_)->use_count + 1;
            }
          }
          local_360._8_8_ =
               (((pointer)_Var9._M_pi)->keys2old_elems).a2ab.write_.shared_alloc_.direct_ptr;
          local_360._16_8_ =
               (((pointer)_Var9._M_pi)->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
          if ((local_360._16_8_ & 7) == 0 && (Alloc *)local_360._16_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_360._16_8_ = ((Alloc *)local_360._16_8_)->size * 8 + 1;
            }
            else {
              ((Alloc *)local_360._16_8_)->use_count = ((Alloc *)local_360._16_8_)->use_count + 1;
            }
          }
          local_360._24_8_ =
               (((pointer)_Var9._M_pi)->keys2old_elems).ab2b.write_.shared_alloc_.direct_ptr;
          local_340 = (((pointer)_Var9._M_pi)->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_340 & 7) == 0 && local_340 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_340 = (Alloc *)(local_340->size * 8 + 1);
            }
            else {
              local_340->use_count = local_340->use_count + 1;
            }
          }
          local_338 = (((pointer)_Var9._M_pi)->keys2new_elems).a2ab.write_.shared_alloc_.direct_ptr;
          local_330 = (((pointer)_Var9._M_pi)->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_330 & 7) == 0 && local_330 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_330 = (Alloc *)(local_330->size * 8 + 1);
            }
            else {
              local_330->use_count = local_330->use_count + 1;
            }
          }
          local_328 = (((pointer)_Var9._M_pi)->keys2new_elems).ab2b.write_.shared_alloc_.direct_ptr;
          local_248.keys2old_elems.a2ab.write_.shared_alloc_.alloc = (Alloc *)local_360._0_8_;
          if ((local_360._0_8_ & 7) == 0 && (Alloc *)local_360._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_248.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)(*(long *)local_360._0_8_ * 8 + 1);
            }
            else {
              *(int *)(local_360._0_8_ + 0x30) = *(int *)(local_360._0_8_ + 0x30) + 1;
            }
          }
          local_248.keys2old_elems.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_360._16_8_;
          if ((local_360._16_8_ & 7) == 0 && (Alloc *)local_360._16_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_248.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)(*(long *)local_360._16_8_ * 8 + 1);
            }
            else {
              *(int *)(local_360._16_8_ + 0x30) = *(int *)(local_360._16_8_ + 0x30) + 1;
            }
          }
          local_248.keys2new_elems.a2ab.write_.shared_alloc_.alloc = local_340;
          if (((ulong)local_340 & 7) == 0 && local_340 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_248.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)(local_340->size * 8 + 1);
            }
            else {
              local_340->use_count = local_340->use_count + 1;
            }
          }
          local_248.keys2new_elems.ab2b.write_.shared_alloc_.alloc = local_330;
          if (((ulong)local_330 & 7) == 0 && local_330 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_248.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)(local_330->size * 8 + 1);
            }
            else {
              local_330->use_count = local_330->use_count + 1;
            }
          }
          local_2c8 = local_3a0.shared_alloc_.alloc;
          if (((ulong)local_3a0.shared_alloc_.alloc & 7) == 0 &&
              local_3a0.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_2c8 = (Alloc *)((local_3a0.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_3a0.shared_alloc_.alloc)->use_count =
                   (local_3a0.shared_alloc_.alloc)->use_count + 1;
            }
          }
          pAVar3 = local_2c8;
          local_2c0 = (pointer)local_3a0.shared_alloc_.direct_ptr;
          new_elem_densities_w_02.shared_alloc_.direct_ptr = in_stack_fffffffffffffc30;
          new_elem_densities_w_02.shared_alloc_.alloc = pAVar13;
          local_248.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr = (void *)local_360._8_8_;
          local_248.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr = (void *)local_360._24_8_;
          local_248.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr = local_338;
          local_248.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr = local_328;
          transfer_by_intersection
                    ((Omega_h *)old_mesh,new_mesh,new_mesh_00,(TagBase *)&local_248,
                     (Cavs *)local_2c8,new_elem_densities_w_02);
          if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
            piVar1 = &pAVar3->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar3);
              operator_delete(pAVar3,0x48);
            }
          }
          Cavs::~Cavs(&local_248);
          Cavs::~Cavs((Cavs *)local_360);
        }
        local_378._8_8_ = (same_ents2old_ents->write_).shared_alloc_.alloc;
        if ((local_378._8_8_ & 7) == 0 && (Alloc *)local_378._8_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_378._8_8_ = ((Alloc *)local_378._8_8_)->size * 8 + 1;
          }
          else {
            ((Alloc *)local_378._8_8_)->use_count = ((Alloc *)local_378._8_8_)->use_count + 1;
          }
        }
        local_368 = (same_ents2old_ents->write_).shared_alloc_.direct_ptr;
        local_390._16_8_ = (same_ents2new_ents->write_).shared_alloc_.alloc;
        if ((local_390._16_8_ & 7) == 0 && (Alloc *)local_390._16_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_390._16_8_ = ((Alloc *)local_390._16_8_)->size * 8 + 1;
          }
          else {
            ((Alloc *)local_390._16_8_)->use_count = ((Alloc *)local_390._16_8_)->use_count + 1;
          }
        }
        local_378._0_8_ = (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
        local_390._0_8_ = local_3a0.shared_alloc_.alloc;
        if (((ulong)local_3a0.shared_alloc_.alloc & 7) == 0 &&
            local_3a0.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_390._0_8_ = (local_3a0.shared_alloc_.alloc)->size * 8 + 1;
          }
          else {
            (local_3a0.shared_alloc_.alloc)->use_count =
                 (local_3a0.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_390._8_8_ = local_3a0.shared_alloc_.direct_ptr;
        pAVar13 = (Alloc *)local_390;
        transfer_common2<double>
                  (old_mesh,new_mesh,ent_dim,(LOs *)(local_378 + 8),(LOs *)(local_390 + 0x10),
                   (TagBase *)new_mesh_00,(Write<double> *)pAVar13);
        uVar4 = local_390._0_8_;
        if ((local_390._0_8_ & 7) == 0 && (Alloc *)local_390._0_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_390._0_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_390._0_8_);
            operator_delete((void *)uVar4,0x48);
          }
        }
        uVar4 = local_390._16_8_;
        if ((local_390._16_8_ & 7) == 0 && (Alloc *)local_390._16_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_390._16_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_390._16_8_);
            operator_delete((void *)uVar4,0x48);
          }
        }
        uVar4 = local_378._8_8_;
        if ((local_378._8_8_ & 7) == 0 && (Alloc *)local_378._8_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_378._8_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_378._8_8_);
            operator_delete((void *)uVar4,0x48);
          }
        }
        pAVar3 = local_3a0.shared_alloc_.alloc;
        if (((ulong)local_3a0.shared_alloc_.alloc & 7) == 0 &&
            local_3a0.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_3a0.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_3a0.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
      }
    }
    bVar6 = should_conserve_any(old_mesh,opts);
    if (bVar6) {
      local_320._0_8_ = (same_ents2old_ents->write_).shared_alloc_.alloc;
      if ((local_320._0_8_ & 7) == 0 && (Alloc *)local_320._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_320._0_8_ = ((Alloc *)local_320._0_8_)->size * 8 + 1;
        }
        else {
          ((Alloc *)local_320._0_8_)->use_count = ((Alloc *)local_320._0_8_)->use_count + 1;
        }
      }
      uVar4 = local_320._0_8_;
      local_320._8_8_ = (same_ents2old_ents->write_).shared_alloc_.direct_ptr;
      local_2d8.write_.shared_alloc_.alloc = (same_ents2new_ents->write_).shared_alloc_.alloc;
      if (((ulong)local_2d8.write_.shared_alloc_.alloc & 7) == 0 &&
          local_2d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_2d8.write_.shared_alloc_.alloc =
               (Alloc *)((local_2d8.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_2d8.write_.shared_alloc_.alloc)->use_count =
               (local_2d8.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      pAVar13 = local_2d8.write_.shared_alloc_.alloc;
      local_2d8.write_.shared_alloc_.direct_ptr =
           (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
      auVar2._4_8_ = 0;
      auVar2._0_4_ = in_stack_fffffffffffffc38;
      transfer_conservation_errors
                ((Omega_h *)old_mesh,(Mesh *)opts,(TransferOpts *)new_mesh,
                 (Mesh *)&stack0xfffffffffffffef8,(CavsByBdryStatus *)local_320,&local_2d8,
                 (LOs *)0x1000101,(OpConservation)(auVar2 << 0x40));
      if (((ulong)pAVar13 & 7) == 0 && pAVar13 != (Alloc *)0x0) {
        piVar1 = &pAVar13->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar13);
          operator_delete(pAVar13,0x48);
        }
      }
      if ((uVar4 & 7) == 0 && (Alloc *)uVar4 != (Alloc *)0x0) {
        piVar1 = (int *)(uVar4 + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)uVar4);
          operator_delete((void *)uVar4,0x48);
        }
      }
    }
    puVar11 = &stack0xffffffffffffffd0;
    puVar12 = (undefined1 *)&stack0xfffffffffffffef8;
    do {
      lVar10 = 0xc0;
      do {
        std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector
                  ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)(puVar12 + lVar10));
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != 0x78);
      puVar11 = puVar11 + -0x48;
      puVar12 = puVar12 + -0x48;
    } while ((pointer *)puVar11 != &stack0xfffffffffffffef8);
    Adj::~Adj((Adj *)local_288);
    Cavs::~Cavs(&local_148);
    pAVar13 = local_2f0;
    if (((ulong)local_2f0 & 7) == 0 && local_2f0 != (Alloc *)0x0) {
      piVar1 = &local_2f0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2f0);
        operator_delete(pAVar13,0x48);
      }
    }
  }
  return;
}

Assistant:

void transfer_densities_and_conserve_coarsen(Mesh* old_mesh,
    TransferOpts const& opts, Mesh* new_mesh, LOs keys2verts, Adj keys2doms,
    LOs prods2new_ents, LOs same_ents2old_ents, LOs same_ents2new_ents) {
  if (!has_densities_or_conserved(old_mesh, opts)) return;
  auto keys2prods = keys2doms.a2ab;
  auto init_cavs = form_initial_cavs(
      old_mesh, new_mesh, VERT, keys2verts, keys2prods, prods2new_ents);
  auto bdry_keys2doms = keys2doms;
  auto cavs = separate_cavities(
      old_mesh, new_mesh, init_cavs, VERT, keys2verts, &bdry_keys2doms);
  auto dim = old_mesh->dim();
  for (Int i = 0; i < old_mesh->ntags(dim); ++i) {
    auto tagbase = old_mesh->get_tag(dim, i);
    if (should_conserve(old_mesh, opts, dim, tagbase) ||
        is_density(old_mesh, opts, dim, tagbase)) {
      auto ncomps = tagbase->ncomps();
      auto new_elem_densities_w = Write<Real>(new_mesh->nelems() * ncomps);
      transfer_by_intersection(old_mesh, new_mesh, tagbase,
          cavs[NOT_BDRY][NO_COLOR][0], new_elem_densities_w);
      transfer_by_intersection(old_mesh, new_mesh, tagbase,
          cavs[TOUCH_BDRY][NO_COLOR][0], new_elem_densities_w);
      for (auto color_cavs : cavs[KEY_BDRY][CLASS_COLOR]) {
        transfer_by_intersection(
            old_mesh, new_mesh, tagbase, color_cavs, new_elem_densities_w);
      }
      transfer_common2(old_mesh, new_mesh, dim, same_ents2old_ents,
          same_ents2new_ents, tagbase, new_elem_densities_w);
    }
  }
  if (!should_conserve_any(old_mesh, opts)) return;
  OpConservation op_conservation;
  op_conservation.density.this_time[NOT_BDRY] = true;
  op_conservation.density.this_time[TOUCH_BDRY] = true;
  op_conservation.density.this_time[KEY_BDRY] = false;
  op_conservation.momentum.this_time[NOT_BDRY] = false;
  op_conservation.momentum.this_time[TOUCH_BDRY] = false;
  op_conservation.momentum.this_time[KEY_BDRY] = false;
  transfer_conservation_errors(old_mesh, opts, new_mesh, cavs,
      same_ents2old_ents, same_ents2new_ents, op_conservation);
}